

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_custom_search_visitor.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  kd_tree<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>,_pico_tree::metric_l2_squared,_int>
  *this;
  search_nn_counter<pico_tree::neighbor<int,_float>_> v;
  neighbor nn;
  point q;
  kd_tree tree;
  scalar area_size;
  size_t point_count;
  max_leaf_size_t max_leaf_size;
  neighbor_type *in_stack_fffffffffffffef8;
  search_nn_counter<pico_tree::neighbor<int,_float>_> *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  search_nn_counter<pico_tree::neighbor<int,_float>_> *visitor;
  point<float,_2UL> *x;
  kd_tree<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>,_pico_tree::metric_l2_squared,_int>
  *in_stack_ffffffffffffff20;
  neighbor_type *in_stack_ffffffffffffff28;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  search_nn_counter<pico_tree::neighbor<int,_float>_> local_a8 [8];
  undefined4 local_1c;
  undefined8 local_18;
  point<float,_2UL> local_10;
  int local_4;
  
  local_4 = 0;
  x = &local_10;
  pico_tree::max_leaf_size_t::max_leaf_size_t((max_leaf_size_t *)x,0xc);
  local_18 = 0x100000;
  local_1c = 0x447a0000;
  visitor = local_a8;
  pico_tree::generate_random_n<pico_tree::point<float,2ul>>
            (in_stack_ffffffffffffff08,(scalar_type)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  pico_tree::
  kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>,_pico_tree::metric_l2_squared,_int>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (space_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)in_stack_ffffffffffffff28,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)in_stack_ffffffffffffff20);
  std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>::~vector
            ((vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_> *
             )visitor);
  search_nn_counter<pico_tree::neighbor<int,_float>_>::search_nn_counter
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  pico_tree::
  kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
  ::search_nearest<pico_tree::point<float,2ul>,search_nn_counter<pico_tree::neighbor<int,float>>>
            (in_stack_ffffffffffffff20,x,visitor);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of points visited: ");
  this = (kd_tree<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>,_pico_tree::metric_l2_squared,_int>
          *)search_nn_counter<pico_tree::neighbor<int,_float>_>::count
                      ((search_nn_counter<pico_tree::neighbor<int,_float>_> *)
                       &stack0xffffffffffffff20);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)&(this->space_).
                                      super__Vector_base<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_4 = 0;
  pico_tree::
  kd_tree<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(this);
  return local_4;
}

Assistant:

int main() {
  using point = pico_tree::point_2f;
  using scalar = typename point::scalar_type;

  pico_tree::max_leaf_size_t max_leaf_size = 12;
  std::size_t point_count = 1024 * 1024;
  scalar area_size = 1000;

  using kd_tree = pico_tree::kd_tree<std::vector<point>>;
  using neighbor = typename kd_tree::neighbor_type;

  kd_tree tree(
      pico_tree::generate_random_n<point>(point_count, area_size),
      max_leaf_size);

  point q{area_size / scalar(2.0), area_size / scalar(2.0)};
  neighbor nn;
  search_nn_counter<neighbor> v(nn);
  tree.search_nearest(q, v);

  std::cout << "Number of points visited: " << v.count() << std::endl;

  return 0;
}